

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O1

time_exactness_t parse_time_exactness(char *value)

{
  int iVar1;
  time_exactness_t tVar2;
  
  iVar1 = strcmp(value,"0");
  tVar2 = TE_NOT_EXACT;
  if ((iVar1 != 0) && (*value != '\0')) {
    iVar1 = strcmp(value,"1");
    tVar2 = TE_NOT_SET - (iVar1 == 0);
  }
  return tVar2;
}

Assistant:

time_exactness_t parse_time_exactness(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return TE_NOT_EXACT;
    else if (strcmp(value, "1") == 0)
        return TE_EXACT;
    else
        return TE_NOT_SET;
}